

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)15>
                 (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double x)

{
  double *pdVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> lag;
  vector<double,_std::allocator<double>_> local_20;
  
  evalLagrange(&local_20,&current->nodes,&current->coeff,x);
  dVar2 = 0.0;
  for (pdVar1 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    dVar2 = dVar2 + ABS(*pdVar1);
  }
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar2;
}

Assistant:

double getValue<rule_maxlebesgue>(CurrentNodes<rule_maxlebesgue> const& current, double x){
    std::vector<double> lag = evalLagrange(current.nodes, current.coeff, x);
    double sum = 0.0;
    for(auto l : lag) sum += std::abs(l);
    return sum;
}